

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

Privkey * cfd::core::operator-(Privkey *__return_storage_ptr__,Privkey *left,ByteData256 *right)

{
  Privkey *this;
  Privkey local_48;
  undefined1 local_21;
  ByteData256 *local_20;
  ByteData256 *right_local;
  Privkey *left_local;
  Privkey *key;
  
  local_21 = 0;
  this = __return_storage_ptr__;
  local_20 = right;
  right_local = (ByteData256 *)left;
  left_local = __return_storage_ptr__;
  Privkey::Privkey(__return_storage_ptr__,__return_storage_ptr__);
  Privkey::operator-=(&local_48,this,local_20);
  Privkey::~Privkey((Privkey *)0x4741a8);
  return __return_storage_ptr__;
}

Assistant:

Privkey operator-(const Privkey &left, const ByteData256 &right) {
  Privkey key = left;
  key -= right;
  return key;
}